

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Analyze(Parse *pParse,Token *pName1,Token *pName2)

{
  sqlite3 *db;
  int iVar1;
  uint uVar2;
  char *zName;
  Index *pOnlyIdx;
  Table *pTab;
  Vdbe *p;
  char *zDb;
  long in_FS_OFFSET;
  Token *pTableName;
  Token *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  local_38 = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    if (pName1 == (Token *)0x0) {
      if (0 < db->nDb) {
        iVar1 = 0;
        do {
          if (iVar1 != 1) {
            analyzeDatabase(pParse,iVar1);
          }
          iVar1 = iVar1 + 1;
        } while (iVar1 < db->nDb);
      }
    }
    else if ((pName2->n == 0) && (iVar1 = sqlite3FindDb(db,pName1), -1 < iVar1)) {
      analyzeDatabase(pParse,iVar1);
    }
    else {
      uVar2 = sqlite3TwoPartName(pParse,pName1,pName2,&local_38);
      if (-1 < (int)uVar2) {
        if (pName2->n == 0) {
          zDb = (char *)0x0;
        }
        else {
          zDb = db->aDb[uVar2].zDbSName;
        }
        zName = sqlite3NameFromToken(db,local_38);
        if (zName != (char *)0x0) {
          pOnlyIdx = sqlite3FindIndex(db,zName,zDb);
          if (pOnlyIdx == (Index *)0x0) {
            pTab = sqlite3LocateTable(pParse,0,zName,zDb);
            if (pTab != (Table *)0x0) {
              pOnlyIdx = (Index *)0x0;
              goto LAB_0017605e;
            }
          }
          else {
            pTab = pOnlyIdx->pTable;
LAB_0017605e:
            analyzeTable(pParse,pTab,pOnlyIdx);
          }
          sqlite3DbFreeNN(db,zName);
        }
      }
    }
    if ((db->nSqlExec == '\0') && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        sqlite3VdbeAddOp3(p,0xa6,0,0,0);
        return;
      }
      goto LAB_001760cf;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_001760cf:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3Analyze(Parse *pParse, Token *pName1, Token *pName2){
  sqlite3 *db = pParse->db;
  int iDb;
  int i;
  char *z, *zDb;
  Table *pTab;
  Index *pIdx;
  Token *pTableName;
  Vdbe *v;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  assert( pName2!=0 || pName1==0 );
  if( pName1==0 ){
    /* Form 1:  Analyze everything */
    for(i=0; i<db->nDb; i++){
      if( i==1 ) continue;  /* Do not analyze the TEMP database */
      analyzeDatabase(pParse, i);
    }
  }else if( pName2->n==0 && (iDb = sqlite3FindDb(db, pName1))>=0 ){
    /* Analyze the schema named as the argument */
    analyzeDatabase(pParse, iDb);
  }else{
    /* Form 3: Analyze the table or index named as an argument */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pTableName);
    if( iDb>=0 ){
      zDb = pName2->n ? db->aDb[iDb].zDbSName : 0;
      z = sqlite3NameFromToken(db, pTableName);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, zDb))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, zDb))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }
  }
  if( db->nSqlExec==0 && (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3VdbeAddOp0(v, OP_Expire);
  }
}